

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clocks.cc
# Opt level: O1

ostream * tchecker::output(ostream *os,clock_reset_t *r,clock_index_t *index)

{
  int iVar1;
  ostream *poVar2;
  invalid_argument *this;
  clock_id_t right_id;
  pointer local_28;
  
  boost::container::dtl::
  flat_tree<boost::container::dtl::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::dtl::select1st<unsigned_int>,_std::less<unsigned_int>,_boost::container::new_allocator<boost::container::dtl::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::find((flat_tree<boost::container::dtl::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::dtl::select1st<unsigned_int>,_std::less<unsigned_int>,_boost::container::new_allocator<boost::container::dtl::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)&local_28,(key_type *)index);
  if (local_28 ==
      (index->_key_map).m_flat_tree.m_data.m_seq.m_holder.m_start +
      (index->_key_map).m_flat_tree.m_data.m_seq.m_holder.m_size) {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"key is not indexed");
LAB_001a0474:
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (os,(local_28->second)._M_dataplus._M_p,(local_28->second)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(os,"=",1);
  iVar1 = r->_value;
  if (r->_right_id == 0x7fffffff) {
    std::ostream::operator<<((ostream *)os,iVar1);
  }
  else {
    if (iVar1 != 0) {
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)os,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"+",1);
    }
    boost::container::dtl::
    flat_tree<boost::container::dtl::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::dtl::select1st<unsigned_int>,_std::less<unsigned_int>,_boost::container::new_allocator<boost::container::dtl::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::find((flat_tree<boost::container::dtl::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::dtl::select1st<unsigned_int>,_std::less<unsigned_int>,_boost::container::new_allocator<boost::container::dtl::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)&local_28,(key_type *)index);
    if (local_28 ==
        (index->_key_map).m_flat_tree.m_data.m_seq.m_holder.m_start +
        (index->_key_map).m_flat_tree.m_data.m_seq.m_holder.m_size) {
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this,"key is not indexed");
      goto LAB_001a0474;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (os,(local_28->second)._M_dataplus._M_p,(local_28->second)._M_string_length);
  }
  return os;
}

Assistant:

std::ostream & output(std::ostream & os, tchecker::clock_reset_t const & r, tchecker::clock_index_t const & index)
{
  os << index.value(r.left_id());
  os << "=";
  tchecker::clock_id_t right_id = r.right_id();
  tchecker::integer_t value = r.value();
  if (right_id != tchecker::REFCLOCK_ID) {
    if (value != 0)
      os << value << "+";
    os << index.value(right_id);
  }
  else
    os << value;
  return os;
}